

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O0

Parsekey __thiscall
free_format_parser::HMpsFF::parseCones(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  bool bVar1;
  ulong uVar2;
  pointer start;
  HMpsFF *this_00;
  undefined8 uVar3;
  char *__nptr;
  HighsLogOptions *in_RSI;
  string *in_RDI;
  HighsInt colidx;
  Parsekey key;
  string colname;
  size_t begin;
  bool skip;
  string strline;
  ConeType conetype;
  string conetypestr;
  string coneparam;
  string thirdarg;
  string secondarg;
  string conename;
  size_t end;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  HMpsFF *in_stack_fffffffffffffe30;
  Parsekey in_stack_fffffffffffffe38;
  undefined2 in_stack_fffffffffffffe3c;
  undefined1 in_stack_fffffffffffffe3e;
  undefined1 in_stack_fffffffffffffe3f;
  vector<free_format_parser::HMpsFF::ConeType,_std::allocator<free_format_parser::HMpsFF::ConeType>_>
  *in_stack_fffffffffffffe40;
  istream *file_00;
  HMpsFF *this_01;
  undefined8 in_stack_fffffffffffffe68;
  string *colname_00;
  size_t in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  Parsekey PVar4;
  string *in_stack_fffffffffffffea8;
  byte local_129;
  undefined1 local_108 [16];
  pointer local_f8;
  pointer local_f0;
  undefined4 local_e4;
  string local_e0 [24];
  undefined8 in_stack_ffffffffffffff38;
  pointer in_stack_ffffffffffffff40;
  pointer in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  string local_98 [32];
  string local_78 [32];
  uint local_58;
  string local_48 [32];
  HMpsFF *local_28;
  HighsLogOptions *local_18;
  Parsekey local_4;
  
  local_28 = (HMpsFF *)0x0;
  local_18 = in_RSI;
  first_word(in_stack_fffffffffffffea8,CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)
            );
  local_28 = (HMpsFF *)first_word_end(in_RDI,in_stack_fffffffffffffe80);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    highsLogUser(local_18,kError,"Cone name missing in CSECTION\n");
    local_4 = kFail;
    local_58 = 1;
    goto LAB_00464ec6;
  }
  first_word(in_stack_fffffffffffffea8,CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)
            );
  start = (pointer)first_word_end(in_RDI,in_stack_fffffffffffffe80);
  local_28 = (HMpsFF *)start;
  first_word(in_stack_fffffffffffffea8,CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)
            );
  this_00 = (HMpsFF *)first_word_end(in_RDI,(size_t)start);
  colname_00 = (string *)&stack0xffffffffffffff47;
  local_28 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff48,"0.0",(allocator *)colname_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
  std::__cxx11::string::string(local_e0);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator=((string *)&stack0xffffffffffffff48,local_78);
    std::__cxx11::string::operator=(local_e0,local_98);
  }
  else {
    std::__cxx11::string::operator=(local_e0,local_78);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe30,
                            (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    if (bVar1) {
      local_e4 = 0;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffe30,
                              (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28))
      ;
      if (bVar1) {
        local_e4 = 1;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffe30,
                                (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28
                                                ));
        if (bVar1) {
          local_e4 = 2;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffe30,
                                  (char *)CONCAT44(in_stack_fffffffffffffe2c,
                                                   in_stack_fffffffffffffe28));
          if (bVar1) {
            local_e4 = 3;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffe30,
                                    (char *)CONCAT44(in_stack_fffffffffffffe2c,
                                                     in_stack_fffffffffffffe28));
            if (bVar1) {
              local_e4 = 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffe30,
                                      (char *)CONCAT44(in_stack_fffffffffffffe2c,
                                                       in_stack_fffffffffffffe28));
              if (bVar1) {
                local_e4 = 5;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffffe30,
                                        (char *)CONCAT44(in_stack_fffffffffffffe2c,
                                                         in_stack_fffffffffffffe28));
                if (!bVar1) {
                  trim((string *)in_stack_fffffffffffffe30,
                       (string *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
                  uVar3 = std::__cxx11::string::c_str();
                  highsLogUser(local_18,kError,"Unrecognized cone type %s\n",uVar3);
                  local_4 = kFail;
                  local_58 = 1;
                  goto LAB_00464e5a;
                }
                local_e4 = 6;
              }
            }
          }
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe40,
                (value_type *)
                CONCAT17(in_stack_fffffffffffffe3f,
                         CONCAT16(in_stack_fffffffffffffe3e,
                                  CONCAT24(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38))));
    std::
    vector<free_format_parser::HMpsFF::ConeType,_std::allocator<free_format_parser::HMpsFF::ConeType>_>
    ::push_back(in_stack_fffffffffffffe40,
                (value_type *)
                CONCAT17(in_stack_fffffffffffffe3f,
                         CONCAT16(in_stack_fffffffffffffe3e,
                                  CONCAT24(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38))));
    __nptr = (char *)std::__cxx11::string::c_str();
    local_f0 = (pointer)atof(__nptr);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe30,
               (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
              );
    file_00 = (istream *)&in_RDI[0x1d]._M_string_length;
    local_108._0_8_ = 0.0;
    local_108._8_8_ = (pointer)0x0;
    local_f8 = (pointer)0x0;
    this_01 = (HMpsFF *)local_108;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x464c2e);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)in_stack_fffffffffffffe30,
                (value_type *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)file_00);
    std::__cxx11::string::string((string *)&stack0xfffffffffffffed8);
    do {
      do {
        in_stack_fffffffffffffe3f =
             getMpsLine(this_01,file_00,
                        (string *)
                        CONCAT17(in_stack_fffffffffffffe3f,
                                 CONCAT16(in_stack_fffffffffffffe3e,
                                          CONCAT24(in_stack_fffffffffffffe3c,
                                                   in_stack_fffffffffffffe38))),
                        (bool *)in_stack_fffffffffffffe30);
        if (!(bool)in_stack_fffffffffffffe3f) {
          local_4 = kFail;
          local_58 = 1;
          goto LAB_00464e3c;
        }
      } while ((local_129 & 1) != 0);
      in_stack_fffffffffffffe3e = timeout(in_stack_fffffffffffffe30);
      if ((bool)in_stack_fffffffffffffe3e) {
        local_4 = kTimeout;
        local_58 = 1;
        break;
      }
      in_stack_fffffffffffffe30 = (HMpsFF *)&stack0xfffffffffffffea8;
      std::__cxx11::string::string((string *)in_stack_fffffffffffffe30);
      in_stack_fffffffffffffe38 =
           checkFirstWord((HMpsFF *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                          (size_t *)in_stack_ffffffffffffff48,(size_t *)in_stack_ffffffffffffff40,
                          (string *)in_stack_ffffffffffffff38);
      bVar1 = in_stack_fffffffffffffe38 == kNone;
      if (bVar1) {
        getColIdx(this_00,colname_00,SUB81((ulong)in_stack_fffffffffffffe68 >> 0x38,0));
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)in_stack_fffffffffffffe30);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)file_00,
                   (value_type_conflict2 *)
                   CONCAT17(in_stack_fffffffffffffe3f,
                            CONCAT16(in_stack_fffffffffffffe3e,
                                     CONCAT24(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)))
                  );
      }
      else {
        PVar4 = in_stack_fffffffffffffe38;
        highsLogDev(local_18,kInfo,"readMPS: Read CSECTION OK\n");
        local_4 = PVar4;
      }
      local_58 = (uint)!bVar1;
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
    } while (local_58 == 0);
LAB_00464e3c:
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
  }
  else {
    trim((string *)in_stack_fffffffffffffe30,
         (string *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    uVar3 = std::__cxx11::string::c_str();
    highsLogUser(local_18,kError,"Cone type missing in CSECTION %s\n",uVar3);
    local_4 = kFail;
    local_58 = 1;
  }
LAB_00464e5a:
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_78);
LAB_00464ec6:
  std::__cxx11::string::~string(local_48);
  return local_4;
}

Assistant:

typename HMpsFF::Parsekey HMpsFF::parseCones(const HighsLogOptions& log_options,
                                             std::istream& file) {
  size_t end = 0;

  // first argument should be cone name
  std::string conename = first_word(section_args, end);
  end = first_word_end(section_args, end);

  if (conename.empty()) {
    highsLogUser(log_options, HighsLogType::kError,
                 "Cone name missing in CSECTION\n");
    return HMpsFF::Parsekey::kFail;
  }

  // second argument is cone parameter, but is optional
  // third argument is cone type
  std::string secondarg = first_word(section_args, end);
  end = first_word_end(section_args, end);

  std::string thirdarg = first_word(section_args, end);
  end = first_word_end(section_args, end);

  std::string coneparam = "0.0";
  std::string conetypestr;
  if (thirdarg.empty()) {
    conetypestr = secondarg;
  } else {
    coneparam = secondarg;
    conetypestr = thirdarg;
  }

  if (conetypestr.empty()) {
    trim(section_args);
    highsLogUser(log_options, HighsLogType::kError,
                 "Cone type missing in CSECTION %s\n", section_args.c_str());
    return HMpsFF::Parsekey::kFail;
  }

  ConeType conetype;
  if (conetypestr == "ZERO")
    conetype = ConeType::kZero;
  else if (conetypestr == "QUAD")
    conetype = ConeType::kQuad;
  else if (conetypestr == "RQUAD")
    conetype = ConeType::kRQuad;
  else if (conetypestr == "PEXP")
    conetype = ConeType::kPExp;
  else if (conetypestr == "PPOW")
    conetype = ConeType::kPPow;
  else if (conetypestr == "DEXP")
    conetype = ConeType::kDExp;
  else if (conetypestr == "DPOW")
    conetype = ConeType::kDPow;
  else {
    trim(conetypestr);
    highsLogUser(log_options, HighsLogType::kError,
                 "Unrecognized cone type %s\n", conetypestr.c_str());
    return HMpsFF::Parsekey::kFail;
  }

  cone_name.push_back(conename);
  cone_type.push_back(conetype);
  cone_param.push_back(atof(coneparam.c_str()));
  cone_entries.push_back(std::vector<HighsInt>());

  // now parse the cone entries: one column per line
  std::string strline;
  bool skip;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin;
    std::string colname;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, colname);

    if (key != Parsekey::kNone) {
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read CSECTION OK\n");
      return key;
    }

    // colname -> colidx
    HighsInt colidx = getColIdx(colname);
    assert(colidx >= 0);
    assert(colidx < num_col);

    cone_entries.back().push_back(colidx);
  }

  return HMpsFF::Parsekey::kFail;
}